

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

void __thiscall
JsrtDebugManager::CallDebugEventCallbackForBreak
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext)

{
  int iVar1;
  DebugContext *pDVar2;
  DebuggingFlags *this_00;
  ScriptContext *this_01;
  undefined1 local_38 [8];
  AutoSetDispatchHaltFlag autoSetDispatchHaltFlag;
  
  AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag
            ((AutoSetDispatchHaltFlag *)local_38,scriptContext,scriptContext->threadContext);
  CallDebugEventCallback(this,debugEvent,eventDataObject,scriptContext,true);
  for (this_01 = scriptContext->threadContext->scriptContextList; this_01 != (ScriptContext *)0x0;
      this_01 = this_01->next) {
    iVar1 = (*(this_01->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_01);
    if ((char)iVar1 != '\0') break;
    pDVar2 = Js::ScriptContext::GetDebugContext(this_01);
    Js::ProbeContainer::AsyncDeactivate(pDVar2->diagProbesContainer);
  }
  this_00 = Js::DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
  DebuggingFlags::SetForceInterpreter(this_00,false);
  AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag((AutoSetDispatchHaltFlag *)local_38);
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallbackForBreak(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext)
{
    AutoSetDispatchHaltFlag autoSetDispatchHaltFlag(scriptContext, scriptContext->GetThreadContext());

    this->CallDebugEventCallback(debugEvent, eventDataObject, scriptContext, true /*isBreak*/);

    for (Js::ScriptContext *tempScriptContext = scriptContext->GetThreadContext()->GetScriptContextList();
    tempScriptContext != nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->GetDebugContext()->GetProbeContainer()->AsyncDeactivate();
    }

    scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(false);
}